

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O3

void test_inverted_5(void)

{
  run("lists should behave like truthy values","\"{{^list}}{{n}}{{/list}}\"",
      "{\"list\": [{\"n\": 1}, {\"n\": 2}, {\"n\": 3}]}",(char *)0x0,"\"\"");
  return;
}

Assistant:

static void
test_inverted_5(void)
{
    run(
        "lists should behave like truthy values",
        "\"{{^list}}{{n}}{{/list}}\"",
        "{\"list\": [{\"n\": 1}, {\"n\": 2}, {\"n\": 3}]}",
        NULL,
        "\"\""
    );
}